

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O0

int ffdhdu(fitsfile *fptr,int *hdutype,int *status)

{
  int iVar1;
  int *exttype;
  int *in_RDX;
  undefined4 *in_RSI;
  int *in_RDI;
  int *in_stack_00000010;
  long naxes [1];
  long ii;
  long nblocks;
  int tmptype;
  LONGLONG in_stack_00000070;
  long *in_stack_00000078;
  int in_stack_00000084;
  int in_stack_00000088;
  int in_stack_0000008c;
  fitsfile *in_stack_00000090;
  LONGLONG in_stack_000000a0;
  int in_stack_000000a8;
  int *in_stack_000000b0;
  fitsfile *in_stack_000000b8;
  int *in_stack_00000168;
  int *in_stack_00000170;
  fitsfile *in_stack_00000178;
  int *in_stack_00000b08;
  long in_stack_00000b10;
  fitsfile *in_stack_00000b18;
  int *in_stack_ffffffffffffffc0;
  int hdunum;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  int local_4;
  
  uVar2 = 0;
  if (*in_RDX < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd((fitsfile *)nblocks,ii._4_4_,(int *)naxes[0],in_stack_00000010);
    }
    if (*(int *)(*(long *)(in_RDI + 2) + 0x54) == 0) {
      *(undefined8 *)(*(long *)(in_RDI + 2) + 0x70) = 0;
      *(undefined8 *)(*(long *)(in_RDI + 2) + 0x80) = 0;
      ffphpr(in_stack_00000090,in_stack_0000008c,in_stack_00000088,in_stack_00000084,
             in_stack_00000078,in_stack_00000070,in_stack_000000a0,in_stack_000000a8,
             in_stack_000000b0);
      if ((0 < (*(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                         (long)(*(int *)(*(long *)(in_RDI + 2) + 0x54) + 1) * 8) + -0xb40) / 0xb40)
         && (iVar1 = ffdblk(in_stack_00000b18,in_stack_00000b10,in_stack_00000b08), 0 < iVar1)) {
        return *in_RDX;
      }
      *(undefined8 *)(*(long *)(in_RDI + 2) + 0x88) = 0xffffffffffffffff;
      ffrdef(in_stack_000000b8,in_stack_000000b0);
    }
    else {
      hdunum = (int)((ulong)((*(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                                       (long)(*(int *)(*(long *)(in_RDI + 2) + 0x54) + 1) * 8) -
                             *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                                      (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8)) / 0xb40) >>
                    0x20);
      iVar1 = ffdblk(in_stack_00000b18,in_stack_00000b10,in_stack_00000b08);
      if (0 < iVar1) {
        return *in_RDX;
      }
      for (exttype = (int *)(long)(*(int *)(*(long *)(in_RDI + 2) + 0x54) + 1);
          (long)exttype <= (long)*(int *)(*(long *)(in_RDI + 2) + 0x60);
          exttype = (int *)((long)exttype + 1)) {
        *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + (long)exttype * 8) =
             *(undefined8 *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) + 8 + (long)exttype * 8);
      }
      *(undefined8 *)
       (*(long *)(*(long *)(in_RDI + 2) + 0x68) +
       (long)(*(int *)(*(long *)(in_RDI + 2) + 0x60) + 1) * 8) = 0;
      *(int *)(*(long *)(in_RDI + 2) + 0x60) = *(int *)(*(long *)(in_RDI + 2) + 0x60) + -1;
      iVar1 = ffrhdu(in_stack_00000178,in_stack_00000170,in_stack_00000168);
      if (0 < iVar1) {
        *in_RDX = 0;
        ffcmsg();
        ffgext((fitsfile *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),hdunum,exttype,
               in_stack_ffffffffffffffc0);
      }
    }
    if (in_RSI != (undefined4 *)0x0) {
      *in_RSI = uVar2;
    }
    local_4 = *in_RDX;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffdhdu(fitsfile *fptr,      /* I - FITS file pointer                   */
           int *hdutype,        /* O - type of the new CHDU after deletion */
           int *status)         /* IO - error status                       */
/*
  Delete the CHDU.  If the CHDU is the primary array, then replace the HDU
  with an empty primary array with no data.   Return the
  type of the new CHDU after the old CHDU is deleted.
*/
{
    int tmptype = 0;
    long nblocks, ii, naxes[1];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->curhdu == 0) /* replace primary array with null image */
    {
        /* ignore any existing keywords */
        (fptr->Fptr)->headend = 0;
        (fptr->Fptr)->nextkey = 0;

        /* write default primary array header */
        ffphpr(fptr,1,8,0,naxes,0,1,1,status);

        /* calc number of blocks to delete (leave just 1 block) */
        nblocks = (long) (( (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu + 1] - 
                2880 ) / 2880);

        /* ffdblk also updates the starting address of all following HDUs */
        if (nblocks > 0)
        {
            if (ffdblk(fptr, nblocks, status) > 0) /* delete the HDU */
                return(*status);
        }

        /* this might not be necessary, but is doesn't hurt */
        (fptr->Fptr)->datastart = DATA_UNDEFINED;

        ffrdef(fptr, status);  /* reinitialize the primary array */
    }
    else
    {

        /* calc number of blocks to delete */
        nblocks = (long) (( (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu + 1] - 
                (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] ) / 2880);

        /* ffdblk also updates the starting address of all following HDUs */
        if (ffdblk(fptr, nblocks, status) > 0) /* delete the HDU */
            return(*status);

        /* delete the CHDU from the list of HDUs */
        for (ii = (fptr->Fptr)->curhdu + 1; ii <= (fptr->Fptr)->maxhdu; ii++)
            (fptr->Fptr)->headstart[ii] = (fptr->Fptr)->headstart[ii + 1];

        (fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1] = 0;
        ((fptr->Fptr)->maxhdu)--; /* decrement the known number of HDUs */

        if (ffrhdu(fptr, &tmptype, status) > 0)  /* initialize next HDU */
        {
            /* failed (end of file?), so move back one HDU */
            *status = 0;
            ffcmsg();       /* clear extraneous error messages */
            ffgext(fptr, ((fptr->Fptr)->curhdu) - 1, &tmptype, status);
        }
    }

    if (hdutype)
       *hdutype = tmptype;

    return(*status);
}